

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> *
convertToUTF8(vector<char,_std::allocator<char>_> *__return_storage_ptr__,
             vector<char,_std::allocator<char>_> *data)

{
  int *piVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  uint *puVar4;
  uint8_t *puVar5;
  unsigned_long uVar6;
  uchar *puVar7;
  long lVar8;
  char *__function;
  uint uVar9;
  vector<char,_std::allocator<char>_> *result;
  size_type sVar10;
  uint32_t *end;
  uint *puVar11;
  T_conflict *source;
  int *piVar12;
  uint *puVar13;
  ulong uVar14;
  allocator_type local_37;
  allocator_type local_36;
  UTF8Writer local_35;
  allocator_type local_34;
  UTF8Writer local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  piVar1 = (int *)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  pcVar2 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar14 = (long)pcVar2 - (long)piVar1;
  piVar12 = (int *)0x0;
  if (uVar14 != 0) {
    piVar12 = piVar1;
  }
  if (3 < uVar14) {
    if (*piVar12 == -0x20000) {
      uVar14 = uVar14 - 4;
      puVar11 = (uint *)((long)piVar12 + (uVar14 & 0xfffffffffffffffc) + 4);
      puVar13 = (uint *)(piVar12 + 1);
      sVar10 = 0;
      puVar4 = puVar13;
      if (3 < uVar14) {
        do {
          uVar9 = *puVar4;
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          lVar8 = 1;
          if ((0x7f < uVar9) && (lVar8 = 2, 0x7ff < uVar9)) {
            lVar8 = 4 - (ulong)(uVar9 < 0x10000);
          }
          sVar10 = sVar10 + lVar8;
          puVar4 = puVar4 + 1;
        } while (puVar4 < puVar11);
      }
      std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,sVar10,&local_34);
      if (sVar10 == 0) {
        return __return_storage_ptr__;
      }
      puVar3 = (uint8_t *)
               (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = puVar3;
      if (3 < uVar14) {
        do {
          uVar9 = *puVar13;
          puVar5 = UTF8Writer::operator()
                             (&local_33,puVar5,
                              uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                              uVar9 << 0x18);
          puVar13 = puVar13 + 1;
        } while (puVar13 < puVar11);
      }
      if (puVar3 + sVar10 == puVar5) {
        return __return_storage_ptr__;
      }
      __function = 
      "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF32Decoder<true>]";
      goto LAB_001150a1;
    }
    if (*piVar12 == 0xfeff) {
      uVar14 = uVar14 - 4;
      puVar11 = (uint *)((long)piVar12 + (uVar14 & 0xfffffffffffffffc) + 4);
      puVar13 = (uint *)(piVar12 + 1);
      sVar10 = 0;
      puVar4 = puVar13;
      if (3 < uVar14) {
        do {
          uVar9 = *puVar4;
          lVar8 = 1;
          if ((0x7f < uVar9) && (lVar8 = 2, 0x7ff < uVar9)) {
            lVar8 = 4 - (ulong)(uVar9 < 0x10000);
          }
          sVar10 = sVar10 + lVar8;
          puVar4 = puVar4 + 1;
        } while (puVar4 < puVar11);
      }
      std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,sVar10,&local_36);
      if (sVar10 == 0) {
        return __return_storage_ptr__;
      }
      puVar3 = (uint8_t *)
               (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = puVar3;
      if (3 < uVar14) {
        do {
          puVar5 = UTF8Writer::operator()(&local_35,puVar5,*puVar13);
          puVar13 = puVar13 + 1;
        } while (puVar13 < puVar11);
      }
      if (puVar3 + sVar10 == puVar5) {
        return __return_storage_ptr__;
      }
      __function = 
      "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF32Decoder<false>]";
      goto LAB_001150a1;
    }
  }
  if (uVar14 < 2) {
LAB_00114f38:
    if ((uVar14 < 3) || (*(char *)((long)piVar12 + 2) != -0x41 || (short)*piVar12 != -0x4411)) {
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)piVar1;
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_finish = pcVar2;
      (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    else {
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                 (char *)((long)piVar12 + 3),(char *)(uVar14 + (long)piVar12),&local_37);
    }
    return __return_storage_ptr__;
  }
  if ((short)*piVar12 == -2) {
    uVar14 = uVar14 - 2 >> 1;
    uVar6 = UTF16Decoder<true>::decode<unsigned_long,UTF8Counter>
                      ((short *)((long)piVar12 + 2),uVar14,0);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,uVar6,&local_31);
    if (uVar6 == 0) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = UTF16Decoder<true>::decode<unsigned_char*,UTF8Writer>
                       ((short *)((long)piVar12 + 2),uVar14,pcVar2);
    if ((uchar *)(pcVar2 + uVar6) == puVar7) {
      return __return_storage_ptr__;
    }
    __function = 
    "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF16Decoder<true>]";
  }
  else {
    if ((short)*piVar12 != -0x101) goto LAB_00114f38;
    uVar14 = uVar14 - 2 >> 1;
    uVar6 = UTF16Decoder<false>::decode<unsigned_long,UTF8Counter>
                      ((short *)((long)piVar12 + 2),uVar14,0);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,uVar6,&local_32);
    if (uVar6 == 0) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = UTF16Decoder<false>::decode<unsigned_char*,UTF8Writer>
                       ((short *)((long)piVar12 + 2),uVar14,pcVar2);
    if ((uchar *)(pcVar2 + uVar6) == puVar7) {
      return __return_storage_ptr__;
    }
    __function = 
    "std::vector<char> convertToUTF8Impl(const char *, size_t) [Decoder = UTF16Decoder<false>]";
  }
LAB_001150a1:
  __assert_fail("beg + utf8Length == end",
                "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/encoding.cpp",
                0x98,__function);
}

Assistant:

std::vector<char> convertToUTF8(std::vector<char> data)
{
	const char* contents = data.empty() ? 0 : &data[0];
	size_t size = data.size();

	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0x0000feff) return convertToUTF8Impl<UTF32Decoder<false>>(contents + 4, size - 4);
	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0xfffe0000) return convertToUTF8Impl<UTF32Decoder<true>>(contents + 4, size - 4);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfeff) return convertToUTF8Impl<UTF16Decoder<false>>(contents + 2, size - 2);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfffe) return convertToUTF8Impl<UTF16Decoder<true>>(contents + 2, size - 2);
	if (size >= 3 && memcmp(contents, "\xef\xbb\xbf", 3) == 0) return std::vector<char>(contents + 3, contents + size);

	return data;
}